

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

ParserResult * __thiscall
Catch::clara::detail::
BoundFlagLambda<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/olegtarasov[P]fastText/src/catch.hpp:9842:20)>
::setFlag(ParserResult *__return_storage_ptr__,
         BoundFlagLambda<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_olegtarasov[P]fastText_src_catch_hpp:9842:20)>
         *this,bool flag)

{
  ((this->m_lambda).config)->abortAfter = 1;
  *(undefined8 *)
   &(__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseResultType>).
    super_ResultBase.m_type = 0;
  (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseResultType>).
  super_ResultBase._vptr_ResultBase = (_func_int **)&PTR__BasicResult_00186788;
  (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_errorMessage).field_2;
  (__return_storage_ptr__->m_errorMessage)._M_string_length = 0;
  (__return_storage_ptr__->m_errorMessage).field_2._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

auto setFlag( bool flag ) -> ParserResult override {
            return LambdaInvoker<typename UnaryLambdaTraits<L>::ReturnType>::invoke( m_lambda, flag );
        }